

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O0

char * Abc_NamReportUnique(Vec_Int_t *vNameIds1,Abc_Nam_t *p1,Abc_Nam_t *p2)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int local_2c;
  int Entry;
  int i;
  Abc_Nam_t *p2_local;
  Abc_Nam_t *p1_local;
  Vec_Int_t *vNameIds1_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vNameIds1);
    if (iVar1 <= local_2c) {
      return (char *)0x0;
    }
    iVar1 = Vec_IntEntry(vNameIds1,local_2c);
    if ((iVar1 < 1) || (iVar2 = Abc_NamObjNumMax(p1), iVar2 <= iVar1)) break;
    pcVar3 = Abc_NamStr(p1,iVar1);
    iVar2 = Abc_NamStrFind(p2,pcVar3);
    if (iVar2 == 0) {
      pcVar3 = Abc_NamStr(p1,iVar1);
      return pcVar3;
    }
    local_2c = local_2c + 1;
  }
  __assert_fail("Entry > 0 && Entry < Abc_NamObjNumMax(p1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilNam.c"
                ,0x24d,"char *Abc_NamReportUnique(Vec_Int_t *, Abc_Nam_t *, Abc_Nam_t *)");
}

Assistant:

char * Abc_NamReportUnique( Vec_Int_t * vNameIds1, Abc_Nam_t * p1, Abc_Nam_t * p2 )
{
    int i, Entry;
    Vec_IntForEachEntry( vNameIds1, Entry, i )
    {
        assert( Entry > 0 && Entry < Abc_NamObjNumMax(p1) );
        if ( Abc_NamStrFind(p2, Abc_NamStr(p1, Entry)) == 0 )
            return Abc_NamStr(p1, Entry);
    }
    return NULL;
}